

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O2

TopicManagerPtr __thiscall miniros::Publisher::getTopicManager(Publisher *this)

{
  __shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long *in_RSI;
  TopicManagerPtr TVar2;
  
  if (*in_RSI == 0) {
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else if (*(long *)(*in_RSI + 0x60) == 0) {
    p_Var1 = &TopicManager::instance()->
              super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    TVar2 = NodeHandle::getTopicManager((NodeHandle *)this);
    in_RDX = TVar2.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  }
  TVar2.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  TVar2.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TopicManagerPtr)
         TVar2.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TopicManagerPtr Publisher::getTopicManager() const {
  if (!impl_)
    return nullptr;
  return impl_->node_handle_? impl_->node_handle_->getTopicManager() : TopicManager::instance();
}